

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O2

int seconds_to_hms(int dayseconds,int *hour,int *minute,int *second)

{
  int s;
  
  if (0x1517f < (uint)dayseconds) {
    coda_set_error(-0x68,"dayseconds argument (%d) is not in the range [0,86400)",dayseconds);
    return -1;
  }
  *hour = (uint)dayseconds / 0xe10;
  *minute = (uint)(ushort)((ushort)((uint)dayseconds % 0xe10) / 0x3c);
  *second = ((uint)dayseconds % 0xe10) % 0x3c;
  return 0;
}

Assistant:

static int seconds_to_hms(int dayseconds, int *hour, int *minute, int *second)
{
    int s = dayseconds;

    if (s < 0 || s > 86399)
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "dayseconds argument (%d) is not in the range [0,86400)", s);
        return -1;
    }

    *hour = s / 3600;
    s %= 3600;
    *minute = s / 60;
    s %= 60;
    *second = s;

    return 0;
}